

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

cmFileList * __thiscall cmFileList::operator/(cmFileList *this,cmFileListGeneratorBase *rhs)

{
  cmFileListGeneratorBase *pcVar1;
  cmFileListGeneratorBase *local_20;
  
  if (this->Last == (cmFileListGeneratorBase *)0x0) {
    (*rhs->_vptr_cmFileListGeneratorBase[3])(&local_20);
    pcVar1 = local_20;
    local_20 = (cmFileListGeneratorBase *)0x0;
    cmsys::auto_ptr<cmFileListGeneratorBase>::reset(&this->First,pcVar1);
    if (local_20 != (cmFileListGeneratorBase *)0x0) {
      (*local_20->_vptr_cmFileListGeneratorBase[1])();
    }
    pcVar1 = (this->First).x_;
  }
  else {
    pcVar1 = cmFileListGeneratorBase::SetNext(this->Last,rhs);
  }
  this->Last = pcVar1;
  return this;
}

Assistant:

cmFileList& operator/(cmFileListGeneratorBase const& rhs)
    {
    if(this->Last)
      {
      this->Last = this->Last->SetNext(rhs);
      }
    else
      {
      this->First = rhs.Clone();
      this->Last = this->First.get();
      }
    return *this;
    }